

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobject.c
# Opt level: O1

int fiobj_iseq____internal_complex__(FIOBJ o,FIOBJ o2)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  size_t sVar4;
  uintptr_t uVar5;
  void *ptr;
  int *piVar6;
  uint uVar7;
  uint uVar8;
  fiobj_object_vtable_s *in_RCX;
  _func_int_FIOBJ_void_ptr *in_RDX;
  _func_int_FIOBJ_void_ptr *task;
  _func_int_FIOBJ_void_ptr *extraout_RDX;
  _func_int_FIOBJ_void_ptr *extraout_RDX_00;
  _func_int_FIOBJ_void_ptr *extraout_RDX_01;
  _func_int_FIOBJ_void_ptr *extraout_RDX_02;
  _func_int_FIOBJ_void_ptr *extraout_RDX_03;
  int iVar9;
  ulong uVar10;
  _func_int_FIOBJ_void_ptr *p_Var11;
  ulong other;
  ulong uVar12;
  _func_int_FIOBJ_void_ptr *p_Var13;
  fiobj_stack_s left;
  fiobj_stack_s right;
  long local_78;
  long lStack_70;
  undefined8 local_68;
  fiobj_object_vtable_s *pfStack_60;
  long local_58;
  long lStack_50;
  undefined8 local_48;
  fiobj_object_vtable_s *pfStack_40;
  
  local_68 = 0;
  pfStack_60 = (fiobj_object_vtable_s *)0x0;
  local_78 = 0;
  lStack_70 = 0;
  local_48 = 0;
  pfStack_40 = (fiobj_object_vtable_s *)0x0;
  local_58 = 0;
  lStack_50 = 0;
  p_Var13 = (_func_int_FIOBJ_void_ptr *)0x0;
  p_Var11 = (_func_int_FIOBJ_void_ptr *)0x0;
  ptr = (void *)0x0;
  do {
    fiobj_each1(o,(size_t)&local_78,in_RDX,in_RCX);
    fiobj_each1(o2,(size_t)&local_58,task,in_RCX);
    in_RDX = extraout_RDX;
switchD_0014592f_default:
    if (lStack_70 != local_78) {
      lVar1 = lStack_70 + -1;
      uVar12 = *(ulong *)((long)pfStack_60 + lStack_70 * 8 + -8);
      if (lStack_50 == local_58) {
        other = 0;
        in_RCX = pfStack_60;
      }
      else {
        other = *(ulong *)((long)pfStack_40 + lStack_50 * 8 + -8);
        in_RCX = pfStack_40;
        lStack_50 = lStack_50 + -1;
      }
      uVar8 = (uint)uVar12;
      lStack_70 = lVar1;
      if (uVar12 != other) {
        iVar3 = 0;
        iVar9 = 0;
        if ((((uVar12 == 0) || (other == 0)) || ((~(uint)other & 6) == 0)) ||
           (((iVar3 = iVar9, (uVar8 & 6) == 6 || ((((uint)other | uVar8) & 1) != 0)) ||
            (*(byte *)(uVar12 & 0xfffffffffffffff8) != *(byte *)(other & 0xfffffffffffffff8)))))
        goto LAB_00145bf1;
        uVar7 = 1;
        if ((uVar12 & 1) == 0) {
          switch(uVar8 & 6) {
          case 0:
            uVar7 = (uint)*(byte *)(uVar12 & 0xfffffffffffffff8);
            break;
          case 2:
            uVar7 = 0x168528;
            break;
          case 4:
            uVar7 = 0x16852a;
            break;
          case 6:
            uVar7 = uVar8;
          }
        }
        uVar7 = (uVar7 & 0xff) - 0x27;
        in_RCX = (fiobj_object_vtable_s *)(ulong)uVar7;
        if (uVar7 < 5) {
          iVar3 = (*(code *)(&DAT_0016851c + *(int *)(&DAT_0016851c + (long)in_RCX * 4)))();
          return iVar3;
        }
        sVar4 = fiobj_i_is_eq(uVar12,other);
        in_RDX = extraout_RDX_00;
        if (sVar4 == 0) goto LAB_00145bf1;
      }
      if (((uVar12 & 1) == 0) && (uVar12 != 0)) {
        switch(uVar8 & 6) {
        case 0:
          bVar2 = *(byte *)(uVar12 & 0xfffffffffffffff8);
          break;
        case 2:
          bVar2 = 0x28;
          break;
        case 4:
          bVar2 = 0x2a;
          break;
        default:
          goto switchD_0014592f_default;
        }
        in_RDX = (_func_int_FIOBJ_void_ptr *)(ulong)(bVar2 - 0x27);
        in_RCX = &FIOBJECT_VTABLE_NUMBER;
        switch(in_RDX) {
        case (_func_int_FIOBJ_void_ptr *)0x0:
          in_RCX = &FIOBJECT_VTABLE_FLOAT;
          break;
        case (_func_int_FIOBJ_void_ptr *)0x1:
          in_RCX = &FIOBJECT_VTABLE_STRING;
          break;
        case (_func_int_FIOBJ_void_ptr *)0x2:
          in_RCX = &FIOBJECT_VTABLE_ARRAY;
          break;
        case (_func_int_FIOBJ_void_ptr *)0x3:
          in_RCX = &FIOBJECT_VTABLE_HASH;
          break;
        case (_func_int_FIOBJ_void_ptr *)0x4:
          in_RCX = &FIOBJECT_VTABLE_DATA;
        }
        if (in_RCX->each != (_func_size_t_FIOBJ_size_t__func_int_FIOBJ_void_ptr_ptr_void_ptr *)0x0)
        {
          if (uVar12 == 0 || (uVar12 & 1) != 0) {
            bVar2 = (uVar12 == 0) * '\x05' + 1;
          }
          else {
            switch(uVar8 & 6) {
            case 0:
              bVar2 = *(byte *)(uVar12 & 0xfffffffffffffff8);
              break;
            case 2:
              bVar2 = 0x28;
              break;
            case 4:
              bVar2 = 0x2a;
              break;
            case 6:
              bVar2 = (byte)uVar12;
            }
          }
          in_RCX = (fiobj_object_vtable_s *)(ulong)(bVar2 - 0x27);
          if (bVar2 - 0x27 < 5) {
            iVar3 = (*(code *)(&DAT_0016857c + *(int *)(&DAT_0016857c + (long)in_RCX * 4)))();
            return iVar3;
          }
          uVar5 = fiobject___noop_count(uVar12);
          in_RDX = extraout_RDX_01;
          if (uVar5 != 0) {
            if ((p_Var11 <= p_Var13) && (p_Var11 <= p_Var13 + 5)) {
              uVar10 = (ulong)(p_Var13 + 5) & 0xfffffffffffffffe;
              ptr = fio_realloc2(ptr,uVar10 * 8 + 0x10,(long)p_Var13 * 8);
              if (ptr == (void *)0x0) goto LAB_00145c37;
              p_Var11 = (_func_int_FIOBJ_void_ptr *)(uVar10 + 2);
            }
            *(ulong *)((long)ptr + (long)p_Var13 * 8) = uVar12;
            in_RDX = p_Var13 + 1;
            if ((p_Var11 <= in_RDX) && (p_Var11 <= p_Var13 + 6)) {
              uVar12 = (ulong)(p_Var13 + 6) & 0xfffffffffffffffe;
              ptr = fio_realloc2(ptr,uVar12 * 8 + 0x10,(long)in_RDX * 8);
              if (ptr == (void *)0x0) {
LAB_00145c37:
                if (0 < FIO_LOG_LEVEL) {
                  FIO_LOG2STDERR(
                                "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.h:4920"
                                );
                }
                kill(0,2);
                piVar6 = __errno_location();
                exit(*piVar6);
              }
              p_Var11 = (_func_int_FIOBJ_void_ptr *)(uVar12 + 2);
              in_RDX = extraout_RDX_02;
            }
            *(ulong *)((long)ptr + (long)p_Var13 * 8 + 8) = other;
            p_Var13 = p_Var13 + 2;
          }
        }
      }
      goto switchD_0014592f_default;
    }
    if (p_Var13 == (_func_int_FIOBJ_void_ptr *)0x0) {
      o2 = 0;
    }
    else {
      o2 = *(ulong *)((long)ptr + (long)p_Var13 * 8 + -8);
      p_Var13 = p_Var13 + -1;
    }
    if (p_Var13 == (_func_int_FIOBJ_void_ptr *)0x0) {
      o = 0;
    }
    else {
      o = *(ulong *)((long)ptr + (long)p_Var13 * 8 + -8);
      p_Var13 = p_Var13 + -1;
    }
    if (o != o2) {
      iVar3 = 0;
      if (((o2 == 0) || (o == 0)) || ((~(uint)o2 & 6) == 0)) goto LAB_00145bf1;
      uVar8 = (uint)o;
      if ((((uVar8 & 6) == 6) || (((uVar8 | (uint)o2) & 1) != 0)) ||
         (*(byte *)(o & 0xfffffffffffffff8) != *(byte *)(o2 & 0xfffffffffffffff8)))
      goto LAB_00145bf1;
      uVar7 = 1;
      if ((o & 1) == 0) {
        switch(uVar8 & 6) {
        case 0:
          uVar7 = (uint)*(byte *)(o & 0xfffffffffffffff8);
          break;
        case 2:
          uVar7 = 0x168528;
          break;
        case 4:
          uVar7 = 0x16852a;
          break;
        case 6:
          uVar7 = uVar8;
        }
      }
      uVar8 = (uVar7 & 0xff) - 0x27;
      in_RCX = (fiobj_object_vtable_s *)(ulong)uVar8;
      if (uVar8 < 5) {
        iVar3 = (*(code *)(&DAT_001685ac + *(int *)(&DAT_001685ac + (long)in_RCX * 4)))();
        return iVar3;
      }
      sVar4 = fiobj_i_is_eq(o,o2);
      in_RDX = extraout_RDX_03;
      if (sVar4 == 0) goto LAB_00145bf1;
    }
  } while (o != 0);
  iVar3 = 1;
LAB_00145bf1:
  fio_free(pfStack_60);
  local_68 = 0;
  pfStack_60 = (fiobj_object_vtable_s *)0x0;
  local_78 = 0;
  lStack_70 = 0;
  fio_free(pfStack_40);
  local_48 = 0;
  pfStack_40 = (fiobj_object_vtable_s *)0x0;
  local_58 = 0;
  lStack_50 = 0;
  fio_free(ptr);
  return iVar3;
}

Assistant:

int fiobj_iseq____internal_complex__(FIOBJ o, FIOBJ o2) {
  // if (FIOBJECT2VTBL(o)->each && FIOBJECT2VTBL(o)->count(o))
  //   return int fiobj_iseq____internal_complex__(const FIOBJ o, const FIOBJ
  //   o2);
  fiobj_stack_s left = FIO_ARY_INIT, right = FIO_ARY_INIT, queue = FIO_ARY_INIT;
  do {
    fiobj_each1(o, 0, fiobj_iseq____internal_complex__task, &left);
    fiobj_each1(o2, 0, fiobj_iseq____internal_complex__task, &right);
    while (fiobj_stack_count(&left)) {
      o = FIOBJ_INVALID;
      o2 = FIOBJ_INVALID;
      fiobj_stack_pop(&left, &o);
      fiobj_stack_pop(&right, &o2);
      if (!fiobj_iseq_simple(o, o2))
        goto unequal;
      if (FIOBJ_IS_ALLOCATED(o) && FIOBJECT2VTBL(o)->each &&
          FIOBJECT2VTBL(o)->count(o)) {
        fiobj_stack_push(&queue, o);
        fiobj_stack_push(&queue, o2);
      }
    }
    o = FIOBJ_INVALID;
    o2 = FIOBJ_INVALID;
    fiobj_stack_pop(&queue, &o2);
    fiobj_stack_pop(&queue, &o);
    if (!fiobj_iseq_simple(o, o2))
      goto unequal;
  } while (o);
  fiobj_stack_free(&left);
  fiobj_stack_free(&right);
  fiobj_stack_free(&queue);
  return 1;
unequal:
  fiobj_stack_free(&left);
  fiobj_stack_free(&right);
  fiobj_stack_free(&queue);
  return 0;
}